

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem markbeingfnz(global_State *g)

{
  lu_mem local_20;
  lu_mem count;
  GCObject *o;
  global_State *g_local;
  
  local_20 = 0;
  for (count = (lu_mem)g->tobefnz; count != 0; count = *(lu_mem *)count) {
    local_20 = local_20 + 1;
    if ((*(byte *)(count + 9) & 0x18) != 0) {
      reallymarkobject(g,(GCObject *)count);
    }
  }
  return local_20;
}

Assistant:

static lu_mem markbeingfnz (global_State *g) {
  GCObject *o;
  lu_mem count = 0;
  for (o = g->tobefnz; o != NULL; o = o->next) {
    count++;
    markobject(g, o);
  }
  return count;
}